

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O1

ConstantValue *
slang::ast::Bitstream::reOrder
          (ConstantValue *__return_storage_ptr__,ConstantValue *value,uint64_t sliceSize,
          uint64_t unpackWidth)

{
  ConstantValue *__args;
  size_type sVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  ulong uVar4;
  PackIterator iter;
  char *iter_00;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint64_t rightWidth;
  uint64_t bit;
  SmallVector<slang::ConstantValue_*,_5UL> packed;
  vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> result;
  anon_class_24_3_4aefb7ac sliceOrAppend;
  char *local_f0;
  uint64_t local_e8;
  ulong local_e0;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_d8;
  uint local_d0;
  byte local_cb;
  uint64_t local_c8;
  ConstantValue *local_c0;
  ulong local_b8;
  uint64_t local_b0;
  SmallVector<slang::ConstantValue_*,_5UL> local_a8;
  vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> local_68;
  anon_class_24_3_4aefb7ac local_48;
  
  uVar2 = ConstantValue::getBitstreamWidth(value);
  uVar3 = unpackWidth;
  if (unpackWidth == 0) {
    uVar3 = uVar2;
  }
  local_e0 = ((uVar3 + sliceSize) - 1) / sliceSize;
  local_c8 = sliceSize;
  if (local_e0 < 2) {
    std::__detail::__variant::
    _Move_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::_Move_ctor_base((_Move_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       *)__return_storage_ptr__,
                      (_Move_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       *)value);
  }
  else {
    local_a8.super_SmallVectorBase<slang::ConstantValue_*>.data_ =
         (pointer)local_a8.super_SmallVectorBase<slang::ConstantValue_*>.firstElement;
    local_a8.super_SmallVectorBase<slang::ConstantValue_*>.len = 0;
    local_a8.super_SmallVectorBase<slang::ConstantValue_*>.cap = 5;
    packBitstream(value,&local_a8.super_SmallVectorBase<slang::ConstantValue_*>);
    sVar1 = local_a8.super_SmallVectorBase<slang::ConstantValue_*>.len;
    if (local_a8.super_SmallVectorBase<slang::ConstantValue_*>.len == 0) {
      std::__detail::__variant::
      _Move_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::_Move_ctor_base((_Move_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         *)__return_storage_ptr__,
                        (_Move_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         *)value);
    }
    else {
      local_e8 = ConstantValue::getBitstreamWidth
                           (*(ConstantValue **)
                             ((long)local_a8.super_SmallVectorBase<slang::ConstantValue_*>.data_ +
                             (local_a8.super_SmallVectorBase<slang::ConstantValue_*>.len - 1) * 8));
      uVar6 = sVar1 - 1;
      if (unpackWidth == 0) {
        uVar4 = 0;
      }
      else {
        uVar4 = uVar2 - unpackWidth;
        if (unpackWidth <= uVar2 && uVar4 != 0) {
          uVar3 = local_e8;
          if (local_e8 <= uVar4) {
            do {
              local_e8 = uVar3;
              local_e8 = ConstantValue::getBitstreamWidth
                                   (*(ConstantValue **)
                                     ((long)local_a8.super_SmallVectorBase<slang::ConstantValue_*>.
                                            data_ + (uVar6 - 1) * 8));
              uVar4 = uVar4 - uVar3;
              uVar6 = uVar6 - 1;
              uVar3 = local_e8;
            } while (local_e8 <= uVar4);
          }
          local_e8 = local_e8 - uVar4;
        }
        uVar4 = unpackWidth % local_c8;
      }
      uVar7 = local_e0;
      local_68.super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar5 = local_a8.super_SmallVectorBase<slang::ConstantValue_*>.len;
      if (local_a8.super_SmallVectorBase<slang::ConstantValue_*>.len <= local_e0) {
        uVar5 = local_e0;
      }
      local_c0 = __return_storage_ptr__;
      std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::reserve
                (&local_68,uVar5);
      local_48.rightWidth = &local_e8;
      local_48.packed = &local_a8;
      local_48.result = &local_68;
      do {
        if (uVar4 == 0) {
          uVar4 = local_c8;
        }
        uVar3 = local_e8;
        uVar2 = local_e8;
        uVar5 = uVar6;
        if (local_e8 <= uVar4) {
          do {
            uVar2 = ConstantValue::getBitstreamWidth
                              (*(ConstantValue **)
                                ((long)local_a8.super_SmallVectorBase<slang::ConstantValue_*>.data_
                                + (uVar5 - 1) * 8));
            uVar4 = uVar4 - uVar3;
            uVar5 = uVar5 - 1;
            uVar3 = uVar2;
          } while (uVar2 <= uVar4);
        }
        local_f0 = (char *)((long)local_a8.super_SmallVectorBase<slang::ConstantValue_*>.data_ +
                           uVar5 * 8);
        local_e0 = uVar7;
        if (uVar4 != 0) {
          uVar2 = uVar2 - uVar4;
          local_b0 = uVar2;
          slicePacked((ast *)&local_d8,(PackIterator *)&local_f0,
                      (PackIterator)
                      ((long)local_a8.super_SmallVectorBase<slang::ConstantValue_*>.data_ +
                      local_a8.super_SmallVectorBase<slang::ConstantValue_*>.len * 8),&local_b0,
                      uVar4);
          std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::
          emplace_back<slang::SVInt>(&local_68,(SVInt *)&local_d8);
          if (((0x40 < local_d0) || ((local_cb & 1) != 0)) && ((void *)local_d8.val != (void *)0x0))
          {
            operator_delete__(local_d8.pVal);
          }
        }
        iter = (PackIterator)(local_f0 + 8);
        uVar4 = uVar5 + 1;
        local_f0 = (char *)iter;
        local_b8 = uVar4;
        for (; uVar4 < uVar6; uVar4 = uVar4 + 1) {
          __args = *iter;
          iter = iter + 1;
          std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::
          emplace_back<slang::ConstantValue>(&local_68,__args);
        }
        local_f0 = (char *)iter;
        if (local_b8 <= uVar6) {
          reOrder::anon_class_24_3_4aefb7ac::operator()(&local_48,iter);
        }
        uVar7 = local_e0 - 1;
        uVar4 = 0;
        uVar6 = uVar5;
        local_e8 = uVar2;
      } while (1 < uVar7);
      iter_00 = (char *)local_a8.super_SmallVectorBase<slang::ConstantValue_*>.data_;
      if (uVar5 != 0) {
        do {
          std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::
          emplace_back<slang::ConstantValue>(&local_68,*(ConstantValue **)iter_00);
          iter_00 = iter_00 + 8;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
      reOrder::anon_class_24_3_4aefb7ac::operator()(&local_48,(PackIterator)iter_00);
      __return_storage_ptr__ = local_c0;
      *(pointer *)
       &(local_c0->value).
        super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        .
        super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        .
        super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        .
        super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        .
        super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        .
        super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           = local_68.
             super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl
             .super__Vector_impl_data._M_start;
      *(pointer *)
       ((long)&(local_c0->value).
               super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
       + 8) = local_68.
              super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
              _M_impl.super__Vector_impl_data._M_finish;
      *(pointer *)
       ((long)&(local_c0->value).
               super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
       + 0x10) = local_68.
                 super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_68.super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      *(__index_type *)
       ((long)&(local_c0->value).
               super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
       + 0x20) = '\x05';
      std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::~vector(&local_68);
    }
    if (local_a8.super_SmallVectorBase<slang::ConstantValue_*>.data_ !=
        (pointer)local_a8.super_SmallVectorBase<slang::ConstantValue_*>.firstElement) {
      operator_delete(local_a8.super_SmallVectorBase<slang::ConstantValue_*>.data_);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ConstantValue Bitstream::reOrder(ConstantValue&& value, uint64_t sliceSize, uint64_t unpackWidth) {
    uint64_t totalWidth = value.getBitstreamWidth();
    SLANG_ASSERT(unpackWidth <= totalWidth);

    uint64_t numBlocks = ((unpackWidth ? unpackWidth : totalWidth) + sliceSize - 1) / sliceSize;
    if (numBlocks <= 1)
        return std::move(value);

    SmallVector<ConstantValue*> packed;
    packBitstream(value, packed);
    if (packed.empty())
        return std::move(value);

    size_t rightIndex = packed.size() - 1; // Right-to-left
    uint64_t rightWidth = packed.back()->getBitstreamWidth();
    uint64_t extraBits = 0;

    if (unpackWidth) {
        if (unpackWidth < totalWidth) { // left-aligned so trim rightmost
            auto trimWidth = totalWidth - unpackWidth;
            while (trimWidth >= rightWidth) {
                rightIndex--;
                trimWidth -= rightWidth;
                rightWidth = packed[rightIndex]->getBitstreamWidth();
            }
            rightWidth -= trimWidth;
        }

        // For unpack, extraBits is for the first block.
        // For pack, extraBits is for the last block.
        extraBits = unpackWidth % sliceSize;
    }

    std::vector<ConstantValue> result;
    result.reserve(std::max<size_t>(packed.size(), numBlocks));
    auto sliceOrAppend = [&](PackIterator iter) {
        if (rightWidth == (*iter)->getBitstreamWidth())
            result.emplace_back(std::move(**iter));
        else {
            uint64_t bit = 0;
            result.emplace_back(slicePacked(iter, std::cend(packed), bit, rightWidth));
        }
    };

    while (numBlocks > 1) {
        size_t index = rightIndex;
        uint64_t width = rightWidth;
        uint64_t slice = sliceSize;
        if (extraBits) {
            slice = extraBits;
            extraBits = 0;
        }
        while (slice >= width) {
            index--;
            slice -= width;
            width = packed[index]->getBitstreamWidth();
        }

        // A block composed of bits from the last "slice" bits of packed[index] to the first
        // "rightWidth" bits of packed[rightIndex].
        auto iter = std::cbegin(packed) + index;
        if (slice) {
            auto bit = width - slice;
            result.emplace_back(slicePacked(iter, std::cend(packed), bit, slice));
            width -= slice;
        }

        iter++;
        auto nextIndex = index;
        while (++index < rightIndex)
            result.emplace_back(std::move(**iter++));

        if (index == rightIndex)
            sliceOrAppend(iter);

        rightIndex = nextIndex;
        rightWidth = width;
        numBlocks--;
    }

    // For pack, the last block may be smaller than slice size.
    auto iter = std::cbegin(packed);
    for (size_t i = 0; i < rightIndex; i++)
        result.emplace_back(std::move(**iter++));
    sliceOrAppend(iter);

    return result;
}